

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_vcproj.cpp
# Opt level: O3

QString * __thiscall
VcprojGenerator::replaceExtraCompilerVariables
          (QString *__return_storage_ptr__,VcprojGenerator *this,QString *var,QStringList *in,
          QStringList *out,ReplaceFor forShell)

{
  QMakeProject *pQVar1;
  qsizetype qVar2;
  QList<ProString> *pQVar3;
  iterator this_00;
  long in_FS_OFFSET;
  QLatin1String QVar4;
  QLatin1String QVar5;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  QString local_1f8;
  QString local_1d8;
  QString local_1b8;
  ProKey local_198;
  QString local_168;
  QString local_148;
  QString local_128;
  QString local_108;
  ProKey local_e8;
  QString local_b8;
  QStringBuilder<QString,_QString> local_98;
  ProString local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  MakefileGenerator::replaceExtraCompilerVariables
            (__return_storage_ptr__,(MakefileGenerator *)this,var,in,out,forShell);
  pQVar1 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
  ProKey::ProKey((ProKey *)&local_68,"VCPROJ_MAKEFILE_DEFINES");
  pQVar3 = &QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,(ProKey *)&local_68)->
            super_QList<ProString>;
  if (&(local_68.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((pQVar3->d).size == 0) {
    ProKey::ProKey(&local_e8,"PRL_EXPORT_DEFINES");
    QVar6.m_data = (storage_type *)0x3;
    QVar6.m_size = (qsizetype)&local_68;
    QString::fromUtf8(QVar6);
    local_108.d.d = local_68.m_string.d.d;
    local_108.d.ptr = local_68.m_string.d.ptr;
    local_108.d.size = local_68.m_string.d.size;
    QVar7.m_data = (storage_type *)0x3;
    QVar7.m_size = (qsizetype)&local_68;
    QString::fromUtf8(QVar7);
    local_128.d.d = local_68.m_string.d.d;
    local_128.d.ptr = local_68.m_string.d.ptr;
    local_128.d.size = local_68.m_string.d.size;
    QVar8.m_data = (storage_type *)0x0;
    QVar8.m_size = (qsizetype)&local_68;
    QString::fromUtf8(QVar8);
    local_148.d.d = local_68.m_string.d.d;
    local_148.d.ptr = local_68.m_string.d.ptr;
    local_148.d.size = local_68.m_string.d.size;
    MakefileGenerator::varGlue
              (&local_b8,(MakefileGenerator *)this,&local_e8,&local_108,&local_128,&local_148);
    ProKey::ProKey(&local_198,"DEFINES");
    QVar9.m_data = (storage_type *)0x3;
    QVar9.m_size = (qsizetype)&local_68;
    QString::fromUtf8(QVar9);
    local_1b8.d.d = local_68.m_string.d.d;
    local_1b8.d.ptr = local_68.m_string.d.ptr;
    local_1b8.d.size = local_68.m_string.d.size;
    QVar10.m_data = (storage_type *)0x3;
    QVar10.m_size = (qsizetype)&local_68;
    QString::fromUtf8(QVar10);
    local_1d8.d.d = local_68.m_string.d.d;
    local_1d8.d.ptr = local_68.m_string.d.ptr;
    local_1d8.d.size = local_68.m_string.d.size;
    QVar11.m_data = (storage_type *)0x0;
    QVar11.m_size = (qsizetype)&local_68;
    QString::fromUtf8(QVar11);
    local_1f8.d.d = local_68.m_string.d.d;
    local_1f8.d.ptr = local_68.m_string.d.ptr;
    local_1f8.d.size = local_68.m_string.d.size;
    MakefileGenerator::varGlue
              (&local_168,(MakefileGenerator *)this,&local_198,&local_1b8,&local_1d8,&local_1f8);
    local_98.a.d.size = local_b8.d.size;
    local_98.a.d.ptr = local_b8.d.ptr;
    local_98.a.d.d = local_b8.d.d;
    local_98.b.d.size = local_168.d.size;
    local_98.b.d.ptr = local_168.d.ptr;
    local_98.b.d.d = local_168.d.d;
    local_b8.d.d = (Data *)0x0;
    local_b8.d.ptr = (char16_t *)0x0;
    local_b8.d.size = 0;
    local_168.d.d = (Data *)0x0;
    local_168.d.ptr = (char16_t *)0x0;
    local_168.d.size = 0;
    ProString::ProString<QString,QString>(&local_68,&local_98);
    QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
              ((QMovableArrayOps<ProString> *)pQVar3,(pQVar3->d).size,&local_68);
    QList<ProString>::end(pQVar3);
    if (&(local_68.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    QStringBuilder<QString,_QString>::~QStringBuilder(&local_98);
    if (&(local_168.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_168.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_168.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_168.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_168.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_1f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_1f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_1f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_1f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_1f8.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_1d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_1d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_1d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_1d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_1d8.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_1b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_1b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_1b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_1b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_1b8.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_198.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_198.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
      super___atomic_base<int>._M_i =
           ((local_198.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_198.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
          super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_198.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_148.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_148.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_128.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_128.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_108.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_108.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_e8.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_e8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
      super___atomic_base<int>._M_i =
           ((local_e8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_e8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
          super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_e8.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  this_00 = QList<ProString>::begin(pQVar3);
  ProString::toQString(&local_68.m_string,this_00.i);
  QVar4.m_data = (char *)0xa;
  QVar4.m_size = (qsizetype)__return_storage_ptr__;
  QString::replace(QVar4,(QString *)0x2afeb2,(CaseSensitivity)&local_68);
  if (&(local_68.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  pQVar1 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
  ProKey::ProKey((ProKey *)&local_68,"VCPROJ_MAKEFILE_INCPATH");
  pQVar3 = &QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,(ProKey *)&local_68)->
            super_QList<ProString>;
  if (&(local_68.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((pQVar3->d).size == 0) {
    ProKey::ProKey((ProKey *)&local_68,"MSVCPROJ_INCPATH");
    (*(this->super_Win32MakefileGenerator).super_MakefileGenerator.super_QMakeSourceFileInfo.
      _vptr_QMakeSourceFileInfo[0x16])(&local_98,this,&local_68);
    qVar2 = local_98.a.d.size;
    if (&(local_98.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_98.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_98.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_98.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_98.a.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_68.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (qVar2 != 0) {
      ProKey::ProKey((ProKey *)&local_98,"MSVCPROJ_INCPATH");
      (*(this->super_Win32MakefileGenerator).super_MakefileGenerator.super_QMakeSourceFileInfo.
        _vptr_QMakeSourceFileInfo[0x16])(&local_e8,this,&local_98);
      ProString::ProString(&local_68,(QString *)&local_e8);
      QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
                ((QMovableArrayOps<ProString> *)pQVar3,(pQVar3->d).size,&local_68);
      QList<ProString>::end(pQVar3);
      if (&(local_68.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             + -1;
        UNLOCK();
        if (((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_e8.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_e8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i =
             ((local_e8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
             super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_e8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
            super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_e8.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_98.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_98.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_98.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_98.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_98.a.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
  }
  ProStringList::join(&local_68.m_string,(ProStringList *)pQVar3,(QChar)0x20);
  QVar5.m_data = (char *)0xa;
  QVar5.m_size = (qsizetype)__return_storage_ptr__;
  QString::replace(QVar5,(QString *)0x2ae46a,(CaseSensitivity)&local_68);
  if (&(local_68.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString VcprojGenerator::replaceExtraCompilerVariables(
        const QString &var, const QStringList &in, const QStringList &out, ReplaceFor forShell)
{
    QString ret = MakefileGenerator::replaceExtraCompilerVariables(var, in, out, forShell);

    ProStringList &defines = project->values("VCPROJ_MAKEFILE_DEFINES");
    if(defines.isEmpty())
        defines.append(varGlue("PRL_EXPORT_DEFINES"," -D"," -D","") +
                       varGlue("DEFINES"," -D"," -D",""));
    ret.replace(QLatin1String("$(DEFINES)"), defines.first().toQString());

    ProStringList &incpath = project->values("VCPROJ_MAKEFILE_INCPATH");
    if(incpath.isEmpty() && !this->var("MSVCPROJ_INCPATH").isEmpty())
        incpath.append(this->var("MSVCPROJ_INCPATH"));
    ret.replace(QLatin1String("$(INCPATH)"), incpath.join(' '));

    return ret;
}